

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2Reference(void *ctx,xmlChar *name)

{
  xmlNodePtr node;
  xmlNodePtr ret;
  xmlParserCtxtPtr ctxt;
  xmlChar *name_local;
  void *ctx_local;
  
  if (ctx != (void *)0x0) {
    node = xmlNewReference(*(xmlDoc **)((long)ctx + 0x10),name);
    if (node == (xmlNodePtr)0x0) {
      xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx);
    }
    else {
      xmlSAX2AppendChild((xmlParserCtxtPtr)ctx,node);
    }
  }
  return;
}

Assistant:

void
xmlSAX2Reference(void *ctx, const xmlChar *name)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr ret;

    if (ctx == NULL) return;
    ret = xmlNewReference(ctxt->myDoc, name);
    if (ret == NULL) {
        xmlSAX2ErrMemory(ctxt);
        return;
    }

    xmlSAX2AppendChild(ctxt, ret);
}